

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O2

void __thiscall
Indexing::HashingClauseVariantIndex::~HashingClauseVariantIndex(HashingClauseVariantIndex *this)

{
  List<Kernel::Clause_*> **ppLVar1;
  bool bVar2;
  IteratorBase local_28;
  
  (this->super_ClauseVariantIndex)._vptr_ClauseVariantIndex =
       (_func_int **)&PTR__HashingClauseVariantIndex_009ea190;
  local_28._next = (this->_entries)._entries;
  local_28._last = (this->_entries)._afterLast;
  local_28._timestamp = (this->_entries)._timestamp;
  while( true ) {
    bVar2 = Lib::
            DHMap<unsigned_int,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
            ::IteratorBase::hasNext(&local_28);
    if (!bVar2) break;
    ppLVar1 = &(local_28._next)->_val;
    local_28._next = local_28._next + 1;
    Lib::List<Kernel::Clause_*>::destroy(*ppLVar1);
  }
  Lib::DHMap<unsigned_int,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>::
  ~DHMap(&this->_entries);
  return;
}

Assistant:

HashingClauseVariantIndex::~HashingClauseVariantIndex()
{
  /*
  unsigned max = 0;
  ClauseList* maxval = 0;
  */

  DHMap<unsigned, ClauseList*>::Iterator iit(_entries);
  while(iit.hasNext()){
    ClauseList* lst = iit.next();

//    unsigned len = lst->length();
//
//    if (len > max) {
//      max = len;
//      maxval->destroy();
//      maxval = lst;
//    } else {
    ClauseList::destroy(lst);
//    }
  }

  /*
  cout << "max bucket of size " << max << endl;
  ClauseList::Iterator it(maxval);
  while (it.hasNext()) {
    Clause* cl = it.next();
    cout << cl->toString() << endl;
  }

  maxval->destroy();
  */
}